

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O2

uint32_t farmhashmk::Hash32Len5to12(char *s,size_t len,uint32_t seed)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint32_t uVar4;
  
  uVar3 = (uint)len;
  iVar1 = *(int *)(s + (ulong)(uVar3 >> 3 & 1) * 4);
  iVar2 = *(int *)(s + (len - 4));
  uVar4 = util::Mur(*(int *)s + uVar3,uVar3 * 5 + seed);
  uVar4 = util::Mur(uVar3 * 5 + iVar2,uVar4);
  uVar4 = util::Mur(iVar1 + 9,uVar4);
  uVar4 = util::fmix(seed ^ uVar4);
  return uVar4;
}

Assistant:

STATIC_INLINE uint32_t Hash32Len5to12(const char *s, size_t len, uint32_t seed = 0) {
  uint32_t a = len, b = len * 5, c = 9, d = b + seed;
  a += Fetch(s);
  b += Fetch(s + len - 4);
  c += Fetch(s + ((len >> 1) & 4));
  return fmix(seed ^ Mur(c, Mur(b, Mur(a, d))));
}